

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void uWS::WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::consume
               (char *src,uint length,WebSocketState<true> *wState,void *user)

{
  bool bVar1;
  unsigned_long payLength;
  byte bVar2;
  uint uVar3;
  uint local_34;
  byte *local_30;
  
  bVar2 = *(byte *)&wState->state;
  uVar3 = bVar2 >> 1 & 0xf;
  local_34 = length;
  local_30 = (byte *)src;
  if ((bVar2 >> 1 & 0xf) != 0) {
    local_30 = (byte *)(src + -(ulong)uVar3);
    local_34 = uVar3 + length;
    memcpy(local_30,(wState->state).spill,(ulong)uVar3);
    bVar2 = *(byte *)&wState->state;
  }
  if (((bVar2 & 1) != 0) ||
     (bVar1 = consumeContinuation((char **)&local_30,&local_34,wState,user), bVar1)) {
    do {
      if (local_34 < 6) goto LAB_0016ab89;
      bVar2 = *local_30;
      if ((bVar2 & 0x40) != 0) {
        bVar1 = WebSocketContext<false,_true>::setCompressed(wState,user);
        if (!bVar1) goto LAB_0016ab7d;
        bVar2 = *local_30;
      }
      if ((bVar2 & 0x30) != 0) {
LAB_0016ab7d:
        us_socket_close(0,user);
        return;
      }
      if ((bVar2 & 0xf) < 3) {
        bVar2 = local_30[1];
      }
      else if (((-1 < (char)bVar2) || (2 < (byte)((bVar2 & 0xf) - 8))) ||
              (bVar2 = local_30[1], (~bVar2 & 0x7e) == 0)) goto LAB_0016ab7d;
      bVar2 = bVar2 & 0x7f;
      if (bVar2 < 0x7e) {
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<6u,unsigned_char>(bVar2,(char **)&local_30,&local_34,wState,user);
      }
      else if (bVar2 == 0x7e) {
        if (local_34 < 8) {
LAB_0016ab89:
          uVar3 = local_34;
          if (local_34 == 0) {
            return;
          }
          memcpy((wState->state).spill,local_30,(ulong)local_34);
          *(byte *)&wState->state = *(byte *)&wState->state & 0xe1 | (char)uVar3 * '\x02';
          return;
        }
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<8u,unsigned_short>
                          (*(ushort *)(local_30 + 2) << 8 | *(ushort *)(local_30 + 2) >> 8,
                           (char **)&local_30,&local_34,wState,user);
      }
      else {
        if (local_34 < 0xe) goto LAB_0016ab89;
        payLength = protocol::cond_byte_swap<unsigned_long>(*(unsigned_long *)(local_30 + 2));
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
                consumeMessage<14u,unsigned_long>
                          (payLength,(char **)&local_30,&local_34,wState,user);
      }
    } while (bVar1 == false);
  }
  return;
}

Assistant:

static inline void consume(char *src, unsigned int length, WebSocketState<isServer> *wState, void *user) {
        if (wState->state.spillLength) {
            src -= wState->state.spillLength;
            length += wState->state.spillLength;
            memcpy(src, wState->state.spill, wState->state.spillLength);
        }
        if (wState->state.wantsHead) {
            parseNext:
            while (length >= SHORT_MESSAGE_HEADER) {

                // invalid reserved bits / invalid opcodes / invalid control frames / set compressed frame
                if ((rsv1(src) && !Impl::setCompressed(wState, user)) || rsv23(src) || (getOpCode(src) > 2 && getOpCode(src) < 8) ||
                    getOpCode(src) > 10 || (getOpCode(src) > 2 && (!isFin(src) || payloadLength(src) > 125))) {
                    Impl::forceClose(wState, user);
                    return;
                }

                if (payloadLength(src) < 126) {
                    if (consumeMessage<SHORT_MESSAGE_HEADER, uint8_t>(payloadLength(src), src, length, wState, user)) {
                        return;
                    }
                } else if (payloadLength(src) == 126) {
                    if (length < MEDIUM_MESSAGE_HEADER) {
                        break;
                    } else if(consumeMessage<MEDIUM_MESSAGE_HEADER, uint16_t>(protocol::cond_byte_swap<uint16_t>(protocol::bit_cast<uint16_t>(src + 2)), src, length, wState, user)) {
                        return;
                    }
                } else if (length < LONG_MESSAGE_HEADER) {
                    break;
                } else if (consumeMessage<LONG_MESSAGE_HEADER, uint64_t>(protocol::cond_byte_swap<uint64_t>(protocol::bit_cast<uint64_t>(src + 2)), src, length, wState, user)) {
                    return;
                }
            }
            if (length) {
                memcpy(wState->state.spill, src, length);
                wState->state.spillLength = length & 0xf;
            }
        } else if (consumeContinuation(src, length, wState, user)) {
            goto parseNext;
        }
    }